

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O3

void ecs_records_clear(ecs_vector_t *records)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  
  uVar2 = ecs_vector_count(records);
  pvVar3 = _ecs_vector_first(records,8,0x10);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      **(undefined8 **)((long)pvVar3 + uVar4 * 8) = 0;
      piVar1 = (int *)(*(long *)((long)pvVar3 + uVar4 * 8) + 8);
      *piVar1 = *piVar1 >> 0x1f;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

void ecs_records_clear(
    ecs_vector_t *records)
{
    int32_t i, count = ecs_vector_count(records);
    ecs_record_t **r = ecs_vector_first(records, ecs_record_t*);

    for (i = 0; i < count; i ++) {
        r[i]->table = NULL;
        if (r[i]->row < 0) {
            r[i]->row = -1;
        } else {
            r[i]->row = 0;
        }
    }
}